

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  ChannelData *pCVar1;
  exr_coding_channel_info_t *peVar2;
  size_t sVar3;
  int byte_1;
  int byte;
  size_t uncSize;
  exr_coding_channel_info_t *curc;
  ChannelData *cd;
  int c;
  int i;
  uint8_t *planarUncBuffer [3];
  DwaCompressor *me_local;
  
  for (i = 0; i < 3; i = i + 1) {
    planarUncBuffer[i] = (uint8_t *)0x0;
    if (me->_planarUncBuffer[i] != (uint8_t *)0x0) {
      planarUncBuffer[i] = me->_planarUncBuffer[i];
    }
  }
  for (c = 0; c < me->_numChannels; c = c + 1) {
    pCVar1 = me->_channelData;
    peVar2 = pCVar1[c].chan;
    sVar3 = (long)peVar2->width * (long)peVar2->height * (long)peVar2->bytes_per_element;
    pCVar1[c].planarUncSize = sVar3;
    pCVar1[c].planarUncBuffer = planarUncBuffer[pCVar1[c].compression];
    pCVar1[c].planarUncBufferEnd = pCVar1[c].planarUncBuffer;
    pCVar1[c].planarUncRle[0] = pCVar1[c].planarUncBuffer;
    pCVar1[c].planarUncRleEnd[0] = pCVar1[c].planarUncRle[0];
    if (pCVar1[c].planarUncBuffer == (uint8_t *)0x0) {
      for (byte = 1; byte < peVar2->bytes_per_element; byte = byte + 1) {
        pCVar1[c].planarUncRle[byte] = (uint8_t *)0x0;
        pCVar1[c].planarUncRleEnd[byte] = (uint8_t *)0x0;
      }
    }
    else {
      for (byte_1 = 1; byte_1 < peVar2->bytes_per_element; byte_1 = byte_1 + 1) {
        pCVar1[c].planarUncRle[byte_1] =
             pCVar1[c].planarUncRle[byte_1 + -1] + peVar2->width * peVar2->height;
        pCVar1[c].planarUncRleEnd[byte_1] = pCVar1[c].planarUncRle[byte_1];
      }
    }
    pCVar1[c].planarUncType = (uint)peVar2->data_type;
    if (pCVar1[c].compression == LOSSY_DCT) {
      pCVar1[c].planarUncType = EXR_PIXEL_FLOAT;
    }
    else {
      planarUncBuffer[pCVar1[c].compression] = planarUncBuffer[pCVar1[c].compression] + sVar3;
    }
  }
  return 0;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (int c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        if (!cd->planarUncBuffer)
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte]    = 0;
                cd->planarUncRleEnd[byte] = 0;
            }
        }
        else
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte] =
                    cd->planarUncRle[byte - 1] + curc->width * curc->height;

                cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
            }
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}